

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::NewDeferId_abi_cxx11_(string *__return_storage_ptr__,cmGlobalGenerator *this)

{
  unsigned_long __val;
  string local_48;
  string_view local_28;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *this_local;
  
  local_18 = this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  local_28 = (string_view)::cm::operator____s("__",2);
  __val = this->NextDeferId;
  this->NextDeferId = __val + 1;
  std::__cxx11::to_string(&local_48,__val);
  cmStrCat<cm::static_string_view,std::__cxx11::string>
            (__return_storage_ptr__,(static_string_view *)&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::NewDeferId()
{
  return cmStrCat("__"_s, std::to_string(this->NextDeferId++));
}